

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O2

void __thiscall phoenix_evsa_t::evsa_guid_t::~evsa_guid_t(evsa_guid_t *this)

{
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__evsa_guid_t_00281060;
  std::__cxx11::string::~string((string *)&this->m_guid);
  return;
}

Assistant:

phoenix_evsa_t::evsa_guid_t::~evsa_guid_t() {
    _clean_up();
}